

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char cVar1;
  size_t sVar2;
  int iVar3;
  string text;
  string encoding;
  ifstream file;
  long *local_258;
  long local_250;
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long local_218 [29];
  undefined8 auStack_130 [36];
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: testEncoding <encoding> <file>",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    iVar3 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_238,argv[1],(allocator<char> *)local_218);
    std::ifstream::ifstream(local_218,argv[2],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to open file: ",0x15);
      __s = argv[2];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105070);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      iVar3 = 2;
      std::ostream::flush();
    }
    else {
      local_258 = local_248;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_258,
                 *(undefined8 *)((long)auStack_130 + *(long *)(local_218[0] + -0x18)),0xffffffff,0,
                 0xffffffff);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_258,local_250);
      if (local_258 != local_248) {
        operator_delete(local_258,local_248[0] + 1);
      }
      iVar3 = 0;
    }
    std::ifstream::~ifstream(local_218);
    if (local_238[0] != local_228) {
      operator_delete(local_238[0],local_228[0] + 1);
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
#ifdef _WIN32
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
#endif
  if (argc <= 2) {
    std::cout << "Usage: testEncoding <encoding> <file>" << std::endl;
    return 1;
  }
  const std::string encoding(argv[1]);
#ifdef _WIN32
  if ((encoding == "UTF8") || (encoding == "UTF-8")) {
    setEncoding(consoleOut, CP_UTF8);
  } else if (encoding == "ANSI") {
    setEncoding(consoleOut, CP_ACP);
  } else if (encoding == "OEM") {
    setEncoding(consoleOut, CP_OEMCP);
  } // else AUTO
#endif
  cmsys::ifstream file(argv[2]);
  if (!file.is_open()) {
    std::cout << "Failed to open file: " << argv[2] << std::endl;
    return 2;
  }
  std::string text((std::istreambuf_iterator<char>(file)),
                   std::istreambuf_iterator<char>());
  std::cout << text;
  return 0;
}